

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rawstr.c
# Opt level: O3

int Curl_raw_equal(char *first,char *second)

{
  char cVar1;
  char cVar2;
  char cVar3;
  char *pcVar4;
  
  cVar3 = *first;
  if (cVar3 != '\0') {
    pcVar4 = first + 1;
    do {
      cVar2 = *second;
      if (cVar2 == '\0') goto LAB_00482e5e;
      cVar1 = Curl_raw_toupper(cVar3);
      cVar2 = Curl_raw_toupper(cVar2);
      if (cVar1 != cVar2) goto LAB_00482e5e;
      second = second + 1;
      cVar3 = *pcVar4;
      pcVar4 = pcVar4 + 1;
    } while (cVar3 != '\0');
  }
  cVar3 = '\0';
LAB_00482e5e:
  cVar3 = Curl_raw_toupper(cVar3);
  cVar2 = Curl_raw_toupper(*second);
  return (int)(cVar3 == cVar2);
}

Assistant:

int Curl_raw_equal(const char *first, const char *second)
{
  while(*first && *second) {
    if(Curl_raw_toupper(*first) != Curl_raw_toupper(*second))
      /* get out of the loop as soon as they don't match */
      break;
    first++;
    second++;
  }
  /* we do the comparison here (possibly again), just to make sure that if the
     loop above is skipped because one of the strings reached zero, we must not
     return this as a successful match */
  return (Curl_raw_toupper(*first) == Curl_raw_toupper(*second));
}